

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_scratch_space * secp256k1_scratch_space_create(secp256k1_context *ctx,size_t max_size)

{
  secp256k1_scratch *psVar1;
  size_t in_RDI;
  secp256k1_callback *unaff_retaddr;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/secp256k1.c"
            ,0xf4,"test condition failed: ctx != NULL");
    abort();
  }
  psVar1 = secp256k1_scratch_create(unaff_retaddr,in_RDI);
  return psVar1;
}

Assistant:

secp256k1_scratch_space* secp256k1_scratch_space_create(const secp256k1_context* ctx, size_t max_size) {
    VERIFY_CHECK(ctx != NULL);
    return secp256k1_scratch_create(&ctx->error_callback, max_size);
}